

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_create_all_obj_from_tval(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object_kind *kind_00;
  object *obj_00;
  object *obj;
  object_kind *kind;
  char s [80];
  char prompt [80];
  int local_1c;
  wchar_t local_18;
  wchar_t i;
  wchar_t art;
  wchar_t tval;
  command_conflict *cmd_local;
  
  _art = cmd;
  wVar2 = cmd_get_arg_number((command *)cmd,"tval",&i);
  if (wVar2 != L'\0') {
    memset(&kind,0,0x50);
    strnfmt(s + 0x48,0x50,"Create all items of which tval (1-%d)? ",0x23);
    _Var1 = get_string(s + 0x48,(char *)&kind,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)&kind,&i);
    if (!_Var1) {
      return;
    }
    if (i < L'\x01') {
      return;
    }
    if (L'#' < i) {
      return;
    }
    cmd_set_arg_number((command *)_art,"tval",i);
  }
  wVar2 = cmd_get_arg_choice((command *)_art,"choice",&local_18);
  if (wVar2 != L'\0') {
    _Var1 = get_check("Create instant artifacts? ");
    local_18 = (wchar_t)_Var1;
    cmd_set_arg_choice((command *)_art,"choice",local_18);
  }
  for (local_1c = 0; local_1c < (int)(uint)z_info->k_max; local_1c = local_1c + 1) {
    kind_00 = k_info + local_1c;
    if ((kind_00->tval == i) &&
       ((local_18 != L'\0' ||
        (_Var1 = flag_has_dbg(kind_00->kind_flags,2,4,"kind->kind_flags","KF_INSTA_ART"), !_Var1))))
    {
      obj_00 = wiz_create_object_from_kind(kind_00);
      wiz_drop_object(obj_00);
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_create_all_obj_from_tval(struct command *cmd)
{
	int tval, art;
	int i;

	if (cmd_get_arg_number(cmd, "tval", &tval) != CMD_OK) {
		char prompt[80];
		char s[80] = "";

		strnfmt(prompt, sizeof(prompt),
			"Create all items of which tval (1-%d)? ", TV_MAX - 1);
		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &tval) || tval < 1 ||
			tval >= TV_MAX) return;
		cmd_set_arg_number(cmd, "tval", tval);
	}

	if (cmd_get_arg_choice(cmd, "choice", &art) != CMD_OK) {
		art = get_check("Create instant artifacts? ");
		cmd_set_arg_choice(cmd, "choice", art);
	}

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		struct object *obj;

		if (kind->tval != tval ||
			(!art && kf_has(kind->kind_flags, KF_INSTA_ART))) continue;

		obj = wiz_create_object_from_kind(kind);
		wiz_drop_object(obj);
	}
}